

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_5::SwapBuffersTest::executeForConfig
          (SwapBuffersTest *this,EGLDisplay display,EGLConfig config)

{
  EglTestContext *this_00;
  bool bVar1;
  Capability CVar2;
  ApiType apiType;
  deUint32 dVar3;
  deBool dVar4;
  GLuint GVar5;
  deUint32 dVar6;
  _anonymous_namespace_ *this_01;
  TestLog *pTVar7;
  char *pcVar8;
  NativeDisplayFactory *factory_00;
  CommandLine *cmdLine;
  NotSupportedError *this_02;
  MessageBuilder *pMVar9;
  NativeDisplay *pNVar10;
  undefined8 uVar11;
  NativeWindow *pNVar12;
  EGLSurface pvVar13;
  EGLContext context_00;
  EGLSurface pvVar14;
  GLuint *pGVar15;
  GLsizei *extraout_RDX;
  GLuint *extraout_RDX_00;
  GLuint *extraout_RDX_01;
  GLuint *extraout_RDX_02;
  GLuint *extraout_RDX_03;
  size_t *psVar16;
  GLdouble *pGVar17;
  GLenum GVar18;
  EGLConfig in_R8;
  Vector<unsigned_int,_4> local_2950;
  ConstPixelBufferAccess local_2940;
  ConstPixelBufferAccess local_2918;
  Vector<float,_4> local_28f0;
  undefined4 local_28e0;
  Vector<float,_4> local_28dc;
  GLuint local_28cc;
  undefined8 uStack_28c8;
  deUint32 posLocation;
  float positions2 [12];
  float positions1 [12];
  undefined1 local_2860 [8];
  TextureLevel frameEnd;
  TextureLevel frameBegin;
  TextureLevel blackFrame;
  TextureLevel whiteFrame;
  undefined1 local_27b8 [4];
  deUint32 program;
  Functions gl;
  UniqueContext context;
  UniqueSurface surface;
  undefined1 local_d50 [8];
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  MessageBuilder local_d38;
  EGLint local_bb4;
  MessageBuilder local_bb0;
  EGLint local_a2c;
  MessageBuilder local_a28;
  EGLint local_8a4;
  MessageBuilder local_8a0;
  EGLint local_71c;
  MessageBuilder local_718;
  EGLint local_594;
  MessageBuilder local_590;
  EGLint local_40c;
  MessageBuilder local_408;
  EGLint local_284;
  MessageBuilder local_280;
  TestLog *local_100;
  TestLog *log;
  NativeWindowFactory *factory;
  int waitFrames;
  string local_c8;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  ScopedLogSection local_50;
  ScopedLogSection logSection;
  string configIdStr;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  SwapBuffersTest *this_local;
  
  this_01 = (_anonymous_namespace_ *)
            EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  egl::(anonymous_namespace)::getConfigIdString_abi_cxx11_
            ((string *)&logSection,this_01,(Library *)display,config,in_R8);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::operator+(&local_a0,"Config ID ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&logSection);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar8,&local_a1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&waitFrames,
                 "Config ID ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&logSection);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,pcVar8,(allocator<char> *)((long)&factory + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_50,pTVar7,&local_80,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&factory + 7));
  std::__cxx11::string::~string((string *)&waitFrames);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_a0);
  factory._0_4_ = 5;
  factory_00 = EglTestContext::getNativeDisplayFactory
                         ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  cmdLine = tcu::TestContext::getCommandLine
                      ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  log = (TestLog *)eglu::selectNativeWindowFactory(factory_00,cmdLine);
  CVar2 = eglu::NativeWindowFactory::getCapabilities((NativeWindowFactory *)log);
  if ((CVar2 & CAPABILITY_READ_SCREEN_PIXELS) != 0) {
    local_100 = tcu::TestContext::getLog
                          ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_280,local_100,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [15])"EGL_RED_SIZE: ");
    local_284 = eglu::getConfigAttribInt((Library *)this_01,display,config,0x3024);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_284);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_280);
    tcu::TestLog::operator<<(&local_408,local_100,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_408,(char (*) [17])"EGL_GREEN_SIZE: ");
    local_40c = eglu::getConfigAttribInt((Library *)this_01,display,config,0x3023);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_40c);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_408);
    tcu::TestLog::operator<<(&local_590,local_100,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_590,(char (*) [16])"EGL_BLUE_SIZE: ");
    local_594 = eglu::getConfigAttribInt((Library *)this_01,display,config,0x3022);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_594);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_590);
    tcu::TestLog::operator<<(&local_718,local_100,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_718,(char (*) [17])"EGL_ALPHA_SIZE: ");
    local_71c = eglu::getConfigAttribInt((Library *)this_01,display,config,0x3021);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_71c);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_718);
    tcu::TestLog::operator<<(&local_8a0,local_100,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_8a0,(char (*) [17])"EGL_DEPTH_SIZE: ");
    local_8a4 = eglu::getConfigAttribInt((Library *)this_01,display,config,0x3025);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_8a4);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_8a0);
    tcu::TestLog::operator<<(&local_a28,local_100,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_a28,(char (*) [19])"EGL_STENCIL_SIZE: ");
    local_a2c = eglu::getConfigAttribInt((Library *)this_01,display,config,0x3026);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_a2c);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a28);
    tcu::TestLog::operator<<(&local_bb0,local_100,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_bb0,(char (*) [14])"EGL_SAMPLES: ");
    local_bb4 = eglu::getConfigAttribInt((Library *)this_01,display,config,0x3031);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_bb4);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_bb0);
    tcu::TestLog::operator<<(&local_d38,local_100,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_d38,(char (*) [9])"Waiting ");
    window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
    _12_4_ = 0x50;
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(int *)&window.
                                       super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                                       .m_data.field_0xc);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [69])
                               "ms after eglSwapBuffers() and glFinish() for frame to become visible"
                       );
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_d38);
    pTVar7 = log;
    pNVar10 = EglTestContext::getNativeDisplay
                        ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
    eglu::WindowParams::WindowParams
              ((WindowParams *)((long)&surface.m_surface + 4),0x80,0x80,VISIBILITY_VISIBLE);
    uVar11 = (**(code **)&pTVar7->m_log->isSessionOpen)
                       (pTVar7,pNVar10,display,config,0,(undefined1 *)((long)&surface.m_surface + 4)
                       );
    de::DefaultDeleter<eglu::NativeWindow>::DefaultDeleter
              ((DefaultDeleter<eglu::NativeWindow> *)((long)&surface.m_surface + 3));
    de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::UniquePtr
              ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_d50,
               uVar11);
    pNVar10 = EglTestContext::getNativeDisplay
                        ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
    pNVar12 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
              operator*((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                        local_d50);
    pvVar13 = eglu::createWindowSurface(pNVar10,pNVar12,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface
              ((UniqueSurface *)&context.m_context,(Library *)this_01,display,pvVar13);
    context_00 = createGLES2Context((Library *)this_01,display,config);
    eglu::UniqueContext::UniqueContext
              ((UniqueContext *)&gl.waitSync,(Library *)this_01,display,context_00);
    glw::Functions::Functions((Functions *)local_27b8);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&blackFrame.m_data.m_cap);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&frameBegin.m_data.m_cap);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&frameEnd.m_data.m_cap);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_2860);
    this_00 = (this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx;
    apiType = glu::ApiType::es(2,0);
    EglTestContext::initGLFunctions(this_00,(Functions *)local_27b8,apiType);
    do {
      pvVar13 = eglu::UniqueSurface::operator*((UniqueSurface *)&context.m_context);
      pvVar14 = eglu::UniqueSurface::operator*((UniqueSurface *)&context.m_context);
      eglu::UniqueContext::operator*((UniqueContext *)&gl.waitSync);
      (**(code **)(*(long *)this_01 + 0x138))(this_01,display,pvVar13,pvVar14);
      dVar3 = (**(code **)(*(long *)this_01 + 0xf8))();
      pGVar15 = (GLuint *)0x131;
      eglu::checkError(dVar3,"makeCurrent(display, *surface, *surface, *context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                       ,0x131);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    positions2[10] = 0.0;
    positions2[0xb] = 0.0;
    positions2[2] = 0.0;
    positions2[3] = 0.0;
    positions2[4] = 0.0;
    positions2[5] = 0.0;
    uStack_28c8 = 0xbf400000bf400000;
    positions2[0] = 0.0;
    positions2[1] = -0.75;
    positions2[6] = -0.75;
    positions2[7] = 0.0;
    positions2[8] = -0.75;
    positions2[9] = -0.75;
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    dVar3 = createGLES2Program((Functions *)local_27b8,pTVar7);
    (*gl.unmapNamedBuffer)(dVar3);
    pcVar8 = "a_pos";
    GVar5 = (*gl.getAttachedShaders)(dVar3,0x2b3b2e6,extraout_RDX,pGVar15);
    local_28cc = GVar5;
    (*gl.enableVertexArrayEXT)(GVar5,(GLenum)pcVar8);
    dVar6 = (*gl.getDoublev)(GVar5,(GLdouble *)pcVar8);
    pcVar8 = "Failed to setup shader program for rendering";
    glu::checkError(dVar6,"Failed to setup shader program for rendering",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                    ,0x150);
    (*gl.clearBufferuiv)(dVar6,(GLint)pcVar8,extraout_RDX_00);
    GVar18 = 0x4000;
    (*gl.clampColor)(0x4000,(GLenum)pcVar8);
    dVar6 = (*gl.getDoublev)(GVar18,(GLdouble *)pcVar8);
    glu::checkError(dVar6,"Failed to clear surface",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                    ,0x155);
    do {
      pvVar13 = eglu::UniqueSurface::operator*((UniqueSurface *)&context.m_context);
      (**(code **)(*(long *)this_01 + 0x188))(this_01,display,pvVar13);
      dVar6 = (**(code **)(*(long *)this_01 + 0xf8))();
      pcVar8 = "swapBuffers(display, *surface)";
      eglu::checkError(dVar6,"swapBuffers(display, *surface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                       ,0x157);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    (*gl.fenceSync)(dVar6,(GLbitfield)pcVar8);
    dVar6 = (*gl.getDoublev)(dVar6,(GLdouble *)pcVar8);
    glu::checkError(dVar6,"glFinish() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                    ,0x159);
    deSleep(0x50);
    pNVar12 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
              operator->((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                         local_d50);
    (*pNVar12->_vptr_NativeWindow[4])();
    pNVar12 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
              operator->((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                         local_d50);
    (*pNVar12->_vptr_NativeWindow[8])(pNVar12,&blackFrame.m_data.m_cap);
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::Vector<float,_4>::Vector(&local_28dc,1.0,1.0,1.0,1.0);
    psVar16 = &blackFrame.m_data.m_cap;
    bVar1 = checkColor(pTVar7,(TextureLevel *)psVar16,&local_28dc);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      (*gl.clearBufferuiv)((GLenum)pTVar7,(GLint)psVar16,extraout_RDX_01);
      GVar18 = 0x4000;
      (*gl.clampColor)(0x4000,(GLenum)psVar16);
      dVar6 = (*gl.getDoublev)(GVar18,(GLdouble *)psVar16);
      glu::checkError(dVar6,"Failed to clear surface",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x167);
      do {
        pvVar13 = eglu::UniqueSurface::operator*((UniqueSurface *)&context.m_context);
        (**(code **)(*(long *)this_01 + 0x188))(this_01,display,pvVar13);
        dVar6 = (**(code **)(*(long *)this_01 + 0xf8))();
        pcVar8 = "swapBuffers(display, *surface)";
        eglu::checkError(dVar6,"swapBuffers(display, *surface)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                         ,0x169);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      (*gl.fenceSync)(dVar6,(GLbitfield)pcVar8);
      dVar6 = (*gl.getDoublev)(dVar6,(GLdouble *)pcVar8);
      glu::checkError(dVar6,"glFinish() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x16b);
      deSleep(0x50);
      pNVar12 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                ::operator->((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                              *)local_d50);
      (*pNVar12->_vptr_NativeWindow[4])();
      pNVar12 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                ::operator->((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                              *)local_d50);
      (*pNVar12->_vptr_NativeWindow[8])(pNVar12,&frameBegin.m_data.m_cap);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::Vector<float,_4>::Vector(&local_28f0,0.0,0.0,0.0,1.0);
      psVar16 = &frameBegin.m_data.m_cap;
      bVar1 = checkColor(pTVar7,(TextureLevel *)psVar16,&local_28f0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        (*gl.clearBufferuiv)((GLenum)pTVar7,(GLint)psVar16,extraout_RDX_02);
        GVar18 = 0x4000;
        (*gl.clampColor)(0x4000,(GLenum)psVar16);
        dVar6 = (*gl.getDoublev)(GVar18,(GLdouble *)psVar16);
        glu::checkError(dVar6,"Failed to clear surface",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x178);
        (*gl.vertexAttribP4uiv)(local_28cc,2,'\x06',(GLuint *)0x0);
        GVar18 = 4;
        pGVar17 = (GLdouble *)0x0;
        (*gl.dispatchComputeIndirect)(4);
        dVar6 = (*gl.getDoublev)(GVar18,pGVar17);
        glu::checkError(dVar6,"Failed to render",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x17c);
        do {
          pvVar13 = eglu::UniqueSurface::operator*((UniqueSurface *)&context.m_context);
          (**(code **)(*(long *)this_01 + 0x188))(this_01,display,pvVar13);
          dVar6 = (**(code **)(*(long *)this_01 + 0xf8))();
          pcVar8 = "swapBuffers(display, *surface)";
          eglu::checkError(dVar6,"swapBuffers(display, *surface)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                           ,0x17e);
          dVar4 = ::deGetFalse();
        } while (dVar4 != 0);
        (*gl.fenceSync)(dVar6,(GLbitfield)pcVar8);
        dVar6 = (*gl.getDoublev)(dVar6,(GLdouble *)pcVar8);
        glu::checkError(dVar6,"glFinish() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x180);
        deSleep(0x50);
        pNVar12 = de::details::
                  UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
                  operator->((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                              *)local_d50);
        (*pNVar12->_vptr_NativeWindow[4])();
        pNVar12 = de::details::
                  UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
                  operator->((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                              *)local_d50);
        psVar16 = &frameEnd.m_data.m_cap;
        (*pNVar12->_vptr_NativeWindow[8])();
        (*gl.clearBufferuiv)((GLenum)pNVar12,(GLint)psVar16,extraout_RDX_03);
        GVar18 = 0x4000;
        (*gl.clampColor)(0x4000,(GLenum)psVar16);
        dVar6 = (*gl.getDoublev)(GVar18,(GLdouble *)psVar16);
        glu::checkError(dVar6,"Failed to clear surface",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x187);
        (*gl.vertexAttribP4uiv)(local_28cc,2,'\x06',(GLuint *)0x0);
        GVar18 = 4;
        pGVar17 = (GLdouble *)0x0;
        (*gl.dispatchComputeIndirect)(4);
        dVar6 = (*gl.getDoublev)(GVar18,pGVar17);
        pcVar8 = "Failed to render";
        glu::checkError(dVar6,"Failed to render",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x18b);
        (*gl.fenceSync)(dVar6,(GLbitfield)pcVar8);
        dVar6 = (*gl.getDoublev)(dVar6,(GLdouble *)pcVar8);
        glu::checkError(dVar6,"glFinish() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x18e);
        deSleep(0x50);
        pNVar12 = de::details::
                  UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
                  operator->((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                              *)local_d50);
        (*pNVar12->_vptr_NativeWindow[8])(pNVar12,local_2860);
        do {
          pvVar13 = eglu::UniqueSurface::operator*((UniqueSurface *)&context.m_context);
          (**(code **)(*(long *)this_01 + 0x188))(this_01,display,pvVar13);
          dVar6 = (**(code **)(*(long *)this_01 + 0xf8))();
          pcVar8 = "swapBuffers(display, *surface)";
          eglu::checkError(dVar6,"swapBuffers(display, *surface)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                           ,0x192);
          dVar4 = ::deGetFalse();
        } while (dVar4 != 0);
        (*gl.fenceSync)(dVar6,(GLbitfield)pcVar8);
        dVar6 = (*gl.getDoublev)(dVar6,(GLdouble *)pcVar8);
        pcVar8 = "glFinish() failed";
        glu::checkError(dVar6,"glFinish() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x194);
        deSleep(0x50);
        pNVar12 = de::details::
                  UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
                  operator->((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                              *)local_d50);
        (*pNVar12->_vptr_NativeWindow[4])();
        (*gl.disableVertexArrayEXT)(local_28cc,(GLenum)pcVar8);
        GVar18 = 0;
        (*gl.unmapNamedBuffer)(0);
        dVar6 = (*gl.getDoublev)(GVar18,(GLdouble *)pcVar8);
        pcVar8 = "Failed to release program state";
        glu::checkError(dVar6,"Failed to release program state",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x19a);
        (*gl.deleteFramebuffers)(dVar3,(GLuint *)pcVar8);
        dVar3 = (*gl.getDoublev)(dVar3,(GLdouble *)pcVar8);
        glu::checkError(dVar3,"glDeleteProgram()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                        ,0x19e);
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&local_2918,(TextureLevel *)&frameEnd.m_data.m_cap);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_2940,(TextureLevel *)local_2860);
        tcu::Vector<unsigned_int,_4>::Vector(&local_2950,0,0,0,0);
        bVar1 = tcu::intThresholdCompare
                          (pTVar7,"Compare end of frame against beginning of frame",
                           "Compare end of frame against beginning of frame",&local_2918,&local_2940
                           ,&local_2950,COMPARE_LOG_RESULT);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          tcu::TestContext::setTestResult
                    ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_FAIL,"Screen pixels changed during frame");
        }
        do {
          (**(code **)(*(long *)this_01 + 0x138))(this_01,display,0,0);
          dVar3 = (**(code **)(*(long *)this_01 + 0xf8))();
          eglu::checkError(dVar3,
                           "makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                           ,0x1ac);
          dVar4 = ::deGetFalse();
        } while (dVar4 != 0);
        local_28e0 = 0;
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Couldn\'t reliably read pixels from screen");
        local_28e0 = 1;
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Couldn\'t reliably read pixels from screen");
      local_28e0 = 1;
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2860);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&frameEnd.m_data.m_cap);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&frameBegin.m_data.m_cap);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&blackFrame.m_data.m_cap);
    eglu::UniqueContext::~UniqueContext((UniqueContext *)&gl.waitSync);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&context.m_context);
    de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniquePtr
              ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_d50);
    tcu::ScopedLogSection::~ScopedLogSection(&local_50);
    std::__cxx11::string::~string((string *)&logSection);
    return;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_02,"eglu::NativeWindow doesn\'t support readScreenPixels()",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
             ,0x114);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void SwapBuffersTest::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&						egl			= m_eglTestCtx.getLibrary();
	const string						configIdStr	(getConfigIdString(egl, display, config));
	tcu::ScopedLogSection				logSection	(m_testCtx.getLog(), ("Config ID " + configIdStr).c_str(), ("Config ID " + configIdStr).c_str());
	const int							waitFrames	= 5;
	const eglu::NativeWindowFactory&	factory		= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	if ((factory.getCapabilities() & eglu::NativeWindow::CAPABILITY_READ_SCREEN_PIXELS) == 0)
		TCU_THROW(NotSupportedError, "eglu::NativeWindow doesn't support readScreenPixels()");

	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "EGL_RED_SIZE: "		<< eglu::getConfigAttribInt(egl, display, config, EGL_RED_SIZE)		<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_GREEN_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_GREEN_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_BLUE_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_BLUE_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_ALPHA_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_ALPHA_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_DEPTH_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_DEPTH_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_STENCIL_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_STENCIL_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_SAMPLES: "		<< eglu::getConfigAttribInt(egl, display, config, EGL_SAMPLES)		<< TestLog::EndMessage;

		log << TestLog::Message << "Waiting " << waitFrames * 16 << "ms after eglSwapBuffers() and glFinish() for frame to become visible" << TestLog::EndMessage;
	}

	de::UniquePtr<eglu::NativeWindow>	window	(factory.createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(128, 128, eglu::WindowParams::VISIBILITY_VISIBLE)));

	eglu::UniqueSurface					surface	(egl, display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, display, config, DE_NULL));
	eglu::UniqueContext					context	(egl, display, createGLES2Context(egl, display, config));
	glw::Functions						gl;
	deUint32							program = 0;

	tcu::TextureLevel					whiteFrame;
	tcu::TextureLevel					blackFrame;
	tcu::TextureLevel					frameBegin;
	tcu::TextureLevel					frameEnd;

	m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));
	EGLU_CHECK_CALL(egl, makeCurrent(display, *surface, *surface, *context));

	try
	{
		const float positions1[] = {
			 0.00f,  0.00f,
			 0.75f,  0.00f,
			 0.75f,  0.75f,

			 0.75f,  0.75f,
			 0.00f,  0.75f,
			 0.00f,  0.00f
		};

		const float positions2[] = {
			-0.75f, -0.75f,
			 0.00f, -0.75f,
			 0.00f,  0.00f,

			 0.00f,  0.00f,
			-0.75f,  0.00f,
			-0.75f, -0.75f
		};

		deUint32 posLocation;

		program	= createGLES2Program(gl, m_testCtx.getLog());

		gl.useProgram(program);
		posLocation	= gl.getAttribLocation(program, "a_pos");
		gl.enableVertexAttribArray(posLocation);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup shader program for rendering");

		// Clear screen to white and check that sceen is white
		gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&whiteFrame);

		if (!checkColor(m_testCtx.getLog(), whiteFrame, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f)))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Couldn't reliably read pixels from screen");
			return;
		}

		// Clear screen to black and check that sceen is black
		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&blackFrame);

		if (!checkColor(m_testCtx.getLog(), blackFrame, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Couldn't reliably read pixels from screen");
			return;
		}

		gl.clearColor(0.7f, 1.0f, 0.3f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions1);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&frameBegin);

		gl.clearColor(0.7f, 0.7f, 1.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions2);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");

		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->readScreenPixels(&frameEnd);

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();

		gl.disableVertexAttribArray(posLocation);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to release program state");

		gl.deleteProgram(program);
		program = 0;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram()");

		if (!tcu::intThresholdCompare(m_testCtx.getLog(), "Compare end of frame against beginning of frame" , "Compare end of frame against beginning of frame", frameBegin.getAccess(), frameEnd.getAccess(), tcu::UVec4(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Screen pixels changed during frame");
	}
	catch (...)
	{
		if (program != 0)
			gl.deleteProgram(program);

		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		throw;
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}